

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

void ArraySortEx(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  uint_fast32_t *puVar1;
  int iVar2;
  uint_fast32_t *puVar3;
  uint_fast32_t *puVar4;
  uint_fast32_t *puVar5;
  uint_fast32_t *puVar6;
  uint_fast32_t Tmp;
  uint_fast32_t local_48;
  bool_t local_40;
  uint_fast32_t *local_38;
  
  if (Count == 0xffffffffffffffff) {
    Count = p->_Used / Width;
  }
  if (1 < Count) {
    if (Width != 8) {
      SlowSort(p,Count,Width,Cmp,CmpParam,Unique);
      return;
    }
    local_40 = Unique;
    if (p == (array *)0x0) {
      __assert_fail("&(*p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x194,
                    "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)");
    }
    puVar5 = (uint_fast32_t *)p->_Begin;
    puVar4 = puVar5 + Count;
    InQSort(puVar5,puVar5 + (Count - 1),Cmp,CmpParam);
    puVar5 = (uint_fast32_t *)p->_Begin;
    puVar6 = puVar5 + 1;
    puVar1 = puVar4;
    if (puVar5 + 1 != puVar4) {
      do {
        local_38 = puVar1;
        puVar3 = puVar6;
        iVar2 = (*Cmp)(CmpParam,puVar3,puVar5);
        if (iVar2 < 0) {
          local_48 = *puVar3;
          do {
            puVar4 = puVar5;
            puVar4[1] = *puVar4;
            if (puVar4 == (uint_fast32_t *)p->_Begin) break;
            iVar2 = (*Cmp)(CmpParam,&local_48,puVar4 + -1);
            puVar5 = puVar4 + -1;
          } while (iVar2 < 0);
          *puVar4 = local_48;
          puVar4 = local_38;
        }
        puVar6 = puVar3 + 1;
        puVar5 = puVar3;
        puVar1 = local_38;
      } while (puVar3 + 1 != puVar4);
    }
    if (local_40 != 0) {
      puVar5 = (uint_fast32_t *)p->_Begin;
      puVar6 = puVar5;
      while (puVar6 = puVar6 + 1, puVar6 != puVar4) {
        iVar2 = (*Cmp)(CmpParam,puVar6,puVar5);
        if (iVar2 != 0) {
          puVar5[1] = *puVar6;
          puVar5 = puVar5 + 1;
        }
      }
      p->_Used = (long)puVar5 + (8 - (long)p->_Begin);
    }
  }
  return;
}

Assistant:

void ArraySortEx(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
    if (Count == ARRAY_AUTO_COUNT)
        Count = ArraySize(p)/Width;

    if (Count<=1)
        return;

    if (Width == sizeof(uint_fast32_t))
    {
        uint_fast32_t* End = ARRAYBEGIN(*p,uint_fast32_t)+Count;
        uint_fast32_t* i;
        uint_fast32_t* j;

        InQSort(ARRAYBEGIN(*p,uint_fast32_t), End-1, Cmp, CmpParam);

        j = ARRAYBEGIN(*p,uint_fast32_t);
        for (i=j+1; i!=End; ++i)
        {
            if (Cmp(CmpParam,i,j) < 0)
            {
                uint_fast32_t Tmp = *i;
                do
                {
                    j[1] = j[0];
                    if (j-- == ARRAYBEGIN(*p,uint_fast32_t))
                        break;
                }
                while (Cmp(CmpParam,&Tmp,j) < 0);
                j[1] = Tmp;
            }
            j = i;
        }

        if (Unique)
        {
            j = ARRAYBEGIN(*p,uint_fast32_t);
            for (i=j+1; i!=End; ++i)
            {
                if (Cmp(CmpParam,i,j) != 0)
                    *(++j) = *i;
            }
            p->_Used = ((j+1)-ARRAYBEGIN(*p,uint_fast32_t)) * sizeof(uint_fast32_t);
        }
        return;
    }

    SlowSort(p, Count, Width, Cmp, CmpParam, Unique);
}